

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O2

int gethtmltagdata(char *str,char *tag,char **pTagParams,char **pTagData)

{
  size_t sVar1;
  char *__dest;
  char *pcVar2;
  char *__dest_00;
  char *__dest_01;
  int iVar3;
  uint uVar4;
  int count;
  char **local_48;
  char *ptr;
  char **local_38;
  
  ptr = (char *)0x0;
  count = 0;
  sVar1 = strlen(tag);
  __dest = (char *)calloc(sVar1 + 2,1);
  if (__dest == (char *)0x0) {
    return 6;
  }
  *__dest = '<';
  strcat(__dest,tag);
  pcVar2 = stristrbeginend(str,__dest,">",&ptr,&count);
  if (pcVar2 == (char *)0x0) {
    iVar3 = 4;
  }
  else {
    sVar1 = (size_t)count;
    local_38 = pTagData;
    pcVar2 = (char *)calloc(sVar1 + 1,1);
    *pTagParams = pcVar2;
    iVar3 = 6;
    local_48 = pTagParams;
    if (pcVar2 != (char *)0x0) {
      memcpy(pcVar2,ptr,sVar1);
      sVar1 = strlen(tag);
      __dest_00 = (char *)calloc(sVar1 + 4,1);
      if (__dest_00 != (char *)0x0) {
        __dest_00[0] = '<';
        __dest_00[1] = '/';
        strcat(__dest_00,tag);
        sVar1 = strlen(__dest_00);
        (__dest_00 + sVar1)[0] = '>';
        (__dest_00 + sVar1)[1] = '\0';
        pcVar2 = stristr(str,__dest_00);
        if ((pcVar2 == (char *)0x0) ||
           (uVar4 = (int)pcVar2 - (int)ptr, count = uVar4, (int)uVar4 < 0)) {
          free(__dest_00);
          free(*local_48);
          iVar3 = 4;
          goto LAB_00148464;
        }
        __dest_01 = (char *)calloc((ulong)(uVar4 + 1),1);
        *local_38 = __dest_01;
        if (__dest_01 != (char *)0x0) {
          memcpy(__dest_01,pcVar2,(ulong)(uVar4 & 0x7fffffff));
          free(__dest_00);
          iVar3 = 0;
          goto LAB_00148464;
        }
        free(__dest_00);
        pcVar2 = *local_48;
      }
      free(pcVar2);
    }
  }
LAB_00148464:
  free(__dest);
  return iVar3;
}

Assistant:

inline int gethtmltagdata(char* str, char* tag, char** pTagParams, char** pTagData)
{
	char* ptr = NULL;
	char* ptr2 = NULL;
	int count = 0;
	char* tagbegin = NULL;
	char* tagend = NULL;

	tagbegin = (char*)calloc(strlen(tag)+2, 1);
	if (tagbegin == NULL)
	{
		return EXIT_OUT_OF_MEMORY;
	}

	tagbegin[0] = '<';
	strcat(tagbegin, tag);

	if (stristrbeginend(str, tagbegin, ">", &ptr, &count) == NULL)
	{
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	*pTagParams = (char*)calloc(count+1, 1);
	if (*pTagParams == NULL)
	{
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}
	
	memcpy(*pTagParams, ptr, count);

	tagend = (char*)calloc(strlen(tag)+4, 1);
	if (tagend == NULL)
	{
		free(*pTagParams);
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}

	tagend[0] = '<';
	tagend[1] = '/';
	strcat(tagend, tag);
	strcat(tagend, ">");

	ptr2 = stristr(str, tagend);
	if (ptr2 == NULL)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	count = (int)(ptr2-ptr);
	if (count < 0)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	*pTagData = (char*)calloc(count+1, 1);
	if (*pTagData == NULL)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}
	
	memcpy(*pTagData, ptr2, count);

	free(tagend);
	free(tagbegin);

	return EXIT_SUCCESS;
}